

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O1

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,void *originalPtr,size_t originalSize,
          size_t newSize)

{
  ChunkHeader *pCVar1;
  void *pvVar2;
  ulong uVar3;
  
  if (originalPtr == (void *)0x0) {
    pvVar2 = Malloc(this,newSize);
    return pvVar2;
  }
  if (newSize == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = originalPtr;
    if (originalSize < newSize) {
      pCVar1 = this->chunkHead_;
      if (((void *)((long)pCVar1 + (pCVar1->size - originalSize) + 0x18) == originalPtr) &&
         (uVar3 = pCVar1->size + (ulong)(((int)newSize - (int)originalSize) + 7U & 0xfffffff8),
         uVar3 <= pCVar1->capacity)) {
        pCVar1->size = uVar3;
      }
      else {
        pvVar2 = Malloc(this,newSize);
        if (pvVar2 == (void *)0x0) {
          __assert_fail("newBuffer != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/vendor/rapidjson/allocators.h"
                        ,0xd5,
                        "void *rapidjson::MemoryPoolAllocator<>::Realloc(void *, size_t, size_t) [BaseAllocator = rapidjson::CrtAllocator]"
                       );
        }
        if (originalSize != 0) {
          pvVar2 = memcpy(pvVar2,originalPtr,originalSize);
          return pvVar2;
        }
      }
    }
  }
  return pvVar2;
}

Assistant:

void* Realloc(void* originalPtr, size_t originalSize, size_t newSize) {
        if (originalPtr == 0)
            return Malloc(newSize);

        if (newSize == 0)
            return NULL;

        // Do not shrink if new size is smaller than original
        if (originalSize >= newSize)
            return originalPtr;

        // Simply expand it if it is the last allocation and there is sufficient space
        if (originalPtr == (char *)(chunkHead_ + 1) + chunkHead_->size - originalSize) {
            size_t increment = static_cast<size_t>(newSize - originalSize);
            increment = RAPIDJSON_ALIGN(increment);
            if (chunkHead_->size + increment <= chunkHead_->capacity) {
                chunkHead_->size += increment;
                return originalPtr;
            }
        }

        // Realloc process: allocate and copy memory, do not free original buffer.
        void* newBuffer = Malloc(newSize);
        RAPIDJSON_ASSERT(newBuffer != 0);   // Do not handle out-of-memory explicitly.
        if (originalSize)
            std::memcpy(newBuffer, originalPtr, originalSize);
        return newBuffer;
    }